

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Endpoints.cpp
# Opt level: O2

Type * soul::createMIDIEventEndpointType(void)

{
  Structure *pSVar1;
  Type *in_RDI;
  StructurePtr s;
  allocator<char> local_81;
  RefCountedPtr<soul::Structure> local_80;
  string local_78;
  undefined1 local_58 [56];
  ReadWriteCount local_20;
  
  pSVar1 = (Structure *)operator_new(0x288);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"Message",(allocator<char> *)local_58);
  Structure::Structure(pSVar1,&local_78,(void *)0x0);
  (pSVar1->super_RefCountedObject).refCount = (pSVar1->super_RefCountedObject).refCount + 1;
  local_80.object = pSVar1;
  std::__cxx11::string::~string((string *)&local_78);
  pSVar1 = RefCountedPtr<soul::Structure>::operator->(&local_80);
  local_58[0] = primitive;
  local_58[1] = invalid;
  local_58[2] = false;
  local_58[3] = false;
  local_58._4_4_ = int32;
  local_58._8_4_ = 0;
  local_58._12_4_ = 0;
  local_58._16_8_ = (Structure *)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_58 + 0x18),"midiBytes",&local_81);
  local_20.numReads = 0;
  local_20.numWrites = 0;
  ArrayWithPreallocation<soul::Structure::Member,_8UL>::push_back
            (&pSVar1->members,(Member *)local_58);
  Structure::Member::~Member((Member *)local_58);
  pSVar1 = RefCountedPtr<soul::Structure>::operator*(&local_80);
  in_RDI->category = structure;
  *(undefined8 *)&in_RDI->arrayElementCategory = 0;
  in_RDI->boundingSize = 0;
  in_RDI->arrayElementBoundingSize = 0;
  (in_RDI->structure).object = pSVar1;
  (pSVar1->super_RefCountedObject).refCount = (pSVar1->super_RefCountedObject).refCount + 1;
  RefCountedPtr<soul::Structure>::~RefCountedPtr(&local_80);
  return in_RDI;
}

Assistant:

Type createMIDIEventEndpointType()
{
    StructurePtr s (*new Structure ("Message", nullptr));
    s->getMembers().push_back ({ PrimitiveType::int32, "midiBytes" });
    return Type::createStruct (*s);
}